

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i y_convolve_4tap_4x2_ssse3
                  (uint8_t *src,ptrdiff_t stride,__m128i *coeffs,__m128i *s_32,__m128i *ss_128)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long in_RCX;
  __m128i *in_RDX;
  long in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i alVar4;
  __m128i src34;
  __m128i src23;
  ulong local_a8;
  ulong local_88;
  
  uVar3 = loadu_int32((void *)(in_RDI + in_RSI));
  local_88 = (ulong)uVar3;
  *(ulong *)(in_RCX + 0x30) = local_88;
  *(undefined8 *)(in_RCX + 0x38) = 0;
  auVar1 = vpunpckldq_avx(*(undefined1 (*) [16])(in_RCX + 0x20),
                          *(undefined1 (*) [16])(in_RCX + 0x30));
  uVar3 = loadu_int32((void *)(in_RDI + in_RSI * 2));
  local_a8 = (ulong)uVar3;
  *(ulong *)(in_RCX + 0x20) = local_a8;
  *(undefined8 *)(in_RCX + 0x28) = 0;
  auVar2 = vpunpckldq_avx(*(undefined1 (*) [16])(in_RCX + 0x30),
                          *(undefined1 (*) [16])(in_RCX + 0x20));
  alVar4 = (__m128i)vpunpcklbw_avx(auVar1,auVar2);
  in_R8[1] = alVar4;
  alVar4 = convolve_4tap_ssse3(in_R8,in_RDX);
  alVar4[0] = alVar4[0];
  alVar4[1] = alVar4[1];
  return alVar4;
}

Assistant:

static inline __m128i y_convolve_4tap_4x2_ssse3(const uint8_t *const src,
                                                const ptrdiff_t stride,
                                                const __m128i coeffs[2],
                                                __m128i s_32[4],
                                                __m128i ss_128[2]) {
  s_32[3] = _mm_cvtsi32_si128(loadu_int32(src + stride));
  const __m128i src23 = _mm_unpacklo_epi32(s_32[2], s_32[3]);
  s_32[2] = _mm_cvtsi32_si128(loadu_int32(src + 2 * stride));
  const __m128i src34 = _mm_unpacklo_epi32(s_32[3], s_32[2]);
  ss_128[1] = _mm_unpacklo_epi8(src23, src34);
  return convolve_4tap_ssse3(ss_128, coeffs);
}